

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

int __thiscall PP_Expression::AND_expression(PP_Expression *this)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 0xffffffff;
  while( true ) {
    uVar2 = equality_expression(this);
    lVar1 = (this->super_Parser).index;
    if (((this->super_Parser).symbols.d.size <= lVar1) ||
       ((this->super_Parser).symbols.d.ptr[lVar1].token != AND)) break;
    (this->super_Parser).index = lVar1 + 1;
    uVar3 = uVar3 & uVar2;
  }
  return uVar3 & uVar2;
}

Assistant:

int PP_Expression::AND_expression()
{
    int value = equality_expression();
    if (test(PP_AND))
        return value & AND_expression();
    return value;
}